

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_TEXM3X2TEX(Context *ctx)

{
  RegisterList *item;
  RegisterList *pRVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  bVar3 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar3 = ctx->minor_ver;
  }
  if (0x10003 < ((uint)bVar3 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s","TEXM3X2TEX opcode not available after Shader Model 1.3");
  }
  if (ctx->texm3x2pad_dst0 == -1) {
    failf(ctx,"%s","TEXM3X2TEX opcode without matching TEXM3X2PAD");
  }
  state_texops(ctx,"TEXM3X2TEX",2,0);
  ctx->reset_texmpad = 1;
  pRVar1 = (ctx->samplers).next;
  if (pRVar1 != (RegisterList *)0x0) {
    uVar2 = (ctx->dest_arg).regnum | 0xa0000;
    while (uVar4 = pRVar1->regtype << 0x10 | pRVar1->regnum, uVar2 != uVar4) {
      if ((uVar2 < uVar4) || (pRVar1 = pRVar1->next, pRVar1 == (RegisterList *)0x0))
      goto LAB_0011613d;
    }
    if (pRVar1->index == 2) {
      return;
    }
  }
LAB_0011613d:
  failf(ctx,"%s","TEXM3X2TEX needs a 2D sampler");
  return;
}

Assistant:

static void state_TEXM3X2TEX(Context *ctx)
{
    if (shader_version_atleast(ctx, 1, 4))
        fail(ctx, "TEXM3X2TEX opcode not available after Shader Model 1.3");
    if (ctx->texm3x2pad_dst0 == -1)
        fail(ctx, "TEXM3X2TEX opcode without matching TEXM3X2PAD");
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    state_texops(ctx, "TEXM3X2TEX", 2, 0);
    ctx->reset_texmpad = 1;

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      ctx->dest_arg.regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

    // A samplermap might change this to something nonsensical.
    if (ttype != TEXTURE_TYPE_2D)
        fail(ctx, "TEXM3X2TEX needs a 2D sampler");
}